

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

int EncodeLossless(uint8_t *data,int width,int height,int effort_level,int use_quality_100,
                  VP8LBitWriter *bw,WebPAuxStats *stats)

{
  int iVar1;
  WebPEncodingError WVar2;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  long in_R9;
  bool bVar3;
  WebPPicture picture;
  WebPConfig config;
  int ok;
  int in_stack_0000032c;
  VP8LBitWriter *in_stack_00000330;
  WebPPicture *in_stack_00000338;
  WebPConfig *in_stack_00000340;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  uint32_t *local_158;
  int local_150;
  int local_4;
  
  WebPPictureInit((WebPPicture *)0x164691);
  iVar1 = WebPPictureAlloc((WebPPicture *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    (*WebPDispatchAlphaToGreen)(in_RDI,in_ESI,in_ESI,in_EDX,local_158,local_150);
    WebPConfigInit((WebPConfig *)0x164718);
    WVar2 = VP8LEncodeStream(in_stack_00000340,in_stack_00000338,in_stack_00000330,in_stack_0000032c
                            );
    WebPPictureFree((WebPPicture *)0x1647c2);
    bVar3 = false;
    if (WVar2 == VP8_ENC_OK) {
      bVar3 = *(int *)(in_R9 + 0x28) == 0;
    }
    if (bVar3) {
      local_4 = 1;
    }
    else {
      VP8LBitWriterWipeOut((VP8LBitWriter *)0x16480e);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int EncodeLossless(const uint8_t* const data, int width, int height,
                          int effort_level,  // in [0..6] range
                          int use_quality_100, VP8LBitWriter* const bw,
                          WebPAuxStats* const stats) {
  int ok = 0;
  WebPConfig config;
  WebPPicture picture;

  WebPPictureInit(&picture);
  picture.width = width;
  picture.height = height;
  picture.use_argb = 1;
  picture.stats = stats;
  if (!WebPPictureAlloc(&picture)) return 0;

  // Transfer the alpha values to the green channel.
  WebPDispatchAlphaToGreen(data, width, picture.width, picture.height,
                           picture.argb, picture.argb_stride);

  WebPConfigInit(&config);
  config.lossless = 1;
  // Enable exact, or it would alter RGB values of transparent alpha, which is
  // normally OK but not here since we are not encoding the input image but  an
  // internal encoding-related image containing necessary exact information in
  // RGB channels.
  config.exact = 1;
  config.method = effort_level;  // impact is very small
  // Set a low default quality for encoding alpha. Ensure that Alpha quality at
  // lower methods (3 and below) is less than the threshold for triggering
  // costly 'BackwardReferencesTraceBackwards'.
  // If the alpha quality is set to 100 and the method to 6, allow for a high
  // lossless quality to trigger the cruncher.
  config.quality =
      (use_quality_100 && effort_level == 6) ? 100 : 8.f * effort_level;
  assert(config.quality >= 0 && config.quality <= 100.f);

  // TODO(urvang): Temporary fix to avoid generating images that trigger
  // a decoder bug related to alpha with color cache.
  // See: https://code.google.com/p/webp/issues/detail?id=239
  // Need to re-enable this later.
  ok = (VP8LEncodeStream(&config, &picture, bw, 0 /*use_cache*/) == VP8_ENC_OK);
  WebPPictureFree(&picture);
  ok = ok && !bw->error_;
  if (!ok) {
    VP8LBitWriterWipeOut(bw);
    return 0;
  }
  return 1;
}